

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper2.cpp
# Opt level: O2

void cpp_wrapper_equality
               (planck_unit_test_t *tc,Dictionary<int,_int> *dict,int key,int *expected_values,
               int expected_num_records,ion_boolean_t key_exists)

{
  planck_unit_result_t pVar1;
  bool bVar2;
  char cVar3;
  int i;
  Cursor<int,_int> *this;
  ulong uVar4;
  int actual;
  ulong uVar5;
  int local_54;
  
  this = Dictionary<int,_int>::equality(dict,key);
  cVar3 = this->cursor->status;
  if (key_exists == '\0') {
    pVar1 = planck_unit_assert_true
                      (tc,(uint)((cVar3 - 2U & 0xfd) != 0),0x6e,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                       ,"condition was true, expected false");
    if (pVar1 == '\0') goto LAB_001016bb;
    bVar2 = Cursor<int,_int>::next(this);
    cVar3 = planck_unit_assert_true
                      (tc,(uint)!bVar2,0x6f,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                       ,"condition was true, expected false");
  }
  else {
    pVar1 = planck_unit_assert_true
                      (tc,(uint)((cVar3 - 2U & 0xfd) == 0),0x79,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                       ,"condition was false, expected true");
    if (pVar1 == '\0') goto LAB_001016bb;
    bVar2 = Cursor<int,_int>::next(this);
    actual = 0;
    uVar5 = 0;
    if (0 < key) {
      uVar5 = (ulong)(uint)key;
    }
    local_54 = 0;
    while (bVar2 != false) {
      for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
        if (expected_values[uVar4] == *(this->record).value) {
          local_54 = (int)uVar4;
          break;
        }
      }
      pVar1 = planck_unit_assert_int_are_equal
                        (tc,key,*(this->record).key,0x85,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                        );
      if (pVar1 == '\0') goto LAB_001016bb;
      pVar1 = planck_unit_assert_int_are_equal
                        (tc,expected_values[local_54],*(this->record).value,0x86,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                        );
      if (pVar1 == '\0') goto LAB_001016bb;
      expected_values[local_54] = 999;
      bVar2 = Cursor<int,_int>::next(this);
      actual = actual + 1;
    }
    pVar1 = planck_unit_assert_true
                      (tc,(uint)((this->cursor->status - 2U & 0xfd) != 0),0x8d,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                       ,"condition was true, expected false");
    if (pVar1 == '\0') goto LAB_001016bb;
    cVar3 = planck_unit_assert_int_are_equal
                      (tc,expected_num_records,actual,0x90,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                      );
  }
  if (cVar3 != '\0') {
    Cursor<int,_int>::~Cursor(this);
    operator_delete(this);
    return;
  }
LAB_001016bb:
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
cpp_wrapper_equality(
	planck_unit_test_t *tc,
	Dictionary<int, int> *dict,
	int key,
	int expected_values[],
	int expected_num_records,
	ion_boolean_t key_exists
) {
	Cursor<int, int> *cursor = dict->equality(key);

	if (!key_exists) {
		PLANCK_UNIT_ASSERT_FALSE(tc, cursor->hasNext());
		PLANCK_UNIT_ASSERT_FALSE(tc, cursor->next());

		delete cursor;

		return;
	}

	int records_found	= 0;
	int curr_pos		= 0;

	PLANCK_UNIT_ASSERT_TRUE(tc, cursor->hasNext());

	ion_cursor_status_t status = cursor->next();

	while (status) {
		for (int i = 0; i < key; i++) {
			if (expected_values[i] == cursor->getValue()) {
				curr_pos = i;
				break;
			}
		}

		PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, key, cursor->getKey());
		PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_values[curr_pos], cursor->getValue());

		expected_values[curr_pos]	= NULL_VALUE;
		status						= cursor->next();
		records_found++;
	}

	PLANCK_UNIT_ASSERT_FALSE(tc, cursor->hasNext());

	/* Check that same number of records are found as were inserted with desired key. */
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_num_records, records_found);

	delete cursor;
}